

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool wallet::RunWithinTxn
               (WalletDatabase *database,string_view process_desc,
               function<bool_(wallet::WalletBatch_&)> *func)

{
  byte bVar1;
  WalletBatch *in_RDX;
  function<bool_(wallet::WalletBatch_&)> *in_RSI;
  long in_FS_OFFSET;
  WalletBatch batch;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_28 [24];
  WalletBatch *pWStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._16_8_ = in_RSI;
  pWStack_10 = in_RDX;
  WalletBatch::WalletBatch
            ((WalletBatch *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (WalletDatabase *)local_28,(bool)in_stack_ffffffffffffff9f);
  bVar1 = RunWithinTxn(pWStack_10,(string_view)batch,
                       (function<bool_(wallet::WalletBatch_&)> *)local_28._16_8_);
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool RunWithinTxn(WalletDatabase& database, std::string_view process_desc, const std::function<bool(WalletBatch&)>& func)
{
    WalletBatch batch(database);
    return RunWithinTxn(batch, process_desc, func);
}